

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O1

void alcCaptureSamples(ALCdevice *_device,ALCvoid *buffer,ALCsizei samples)

{
  DeviceWrapper *device;
  
  device = &null_device;
  if (_device != (ALCdevice *)0x0) {
    device = (DeviceWrapper *)_device;
  }
  APILOCK();
  IO_ENTRYINFO(ALEE_alcCaptureSamples);
  IO_UINT64((uint64)_device);
  IO_UINT64((uint64)buffer);
  IO_UINT64((long)samples);
  if ((samples != 0) && (device->samplesize != 0)) {
    memset(buffer,0,(long)(device->samplesize * samples));
  }
  (*REAL_alcCaptureSamples)(device->device,buffer,samples);
  IO_BLOB((uint8 *)buffer,(long)device->samplesize * (long)samples);
  check_alc_error_events(device);
  check_al_async_states();
  APIUNLOCK();
  return;
}

Assistant:

void alcCaptureSamples(ALCdevice *_device, ALCvoid *buffer, ALCsizei samples)
{
    DeviceWrapper *device = _device ? (DeviceWrapper *) _device : &null_device;
    IO_START(alcCaptureSamples);
    IO_PTR(_device);
    IO_PTR(buffer);
    IO_ALCSIZEI(samples);
    if (samples && device->samplesize) {
        memset(buffer, '\0', samples * device->samplesize);
    }
    REAL_alcCaptureSamples(device->device, buffer, samples);
    IO_BLOB(buffer, samples * device->samplesize);
    IO_END_ALC(device);
}